

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpUnSubscribeAsync(UpnpClient_Handle Hnd,char *SubsId,Upnp_FunPtr Fun,void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  undefined4 *arg;
  Handle_Info **HndInfo;
  int iVar3;
  ThreadPoolJob job;
  Handle_Info *local_70;
  ThreadPoolJob local_68;
  
  local_68.func = (start_routine)0x0;
  local_68.arg = (void *)0x0;
  local_68.free_func = (free_routine)0x0;
  local_68.requestTime.tv_sec = 0;
  local_68.requestTime.tv_usec = 0;
  local_68.priority = LOW_PRIORITY;
  local_68.jobId = 0;
  iVar2 = 6;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x967,"Inside UpnpUnSubscribeAsync\n");
  iVar3 = -0x74;
  if ((UpnpSdkInit == 1) && (iVar3 = -0x65, Fun != (Upnp_FunPtr)0x0 && SubsId != (char *)0x0)) {
    HandleReadLock((char *)0x978,iVar2);
    HndInfo = &local_70;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    if (UVar1 == HND_CLIENT) {
      HandleUnlock((char *)0x981,(int)HndInfo);
      arg = (undefined4 *)calloc(1,0x760);
      if (arg == (undefined4 *)0x0) {
        iVar3 = -0x68;
      }
      else {
        *arg = 1;
        arg[1] = Hnd;
        strncpy((char *)(arg + 0x1c3),SubsId,0x2b);
        *(Upnp_FunPtr *)(arg + 0x1d0) = Fun;
        *(void **)(arg + 0x1ce) = Cookie_const;
        TPJobInit(&local_68,UpnpThreadDistribution,arg);
        TPJobSetFreeFunction(&local_68,free);
        TPJobSetPriority(&local_68,MED_PRIORITY);
        iVar3 = 0;
        iVar2 = ThreadPoolAdd(&gSendThreadPool,&local_68,(int *)0x0);
        if (iVar2 != 0) {
          free(arg);
        }
      }
    }
    else {
      HandleUnlock((char *)0x97d,(int)HndInfo);
      iVar3 = -100;
    }
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x99b,"Exiting UpnpUnSubscribeAsync\n");
  return iVar3;
}

Assistant:

int UpnpUnSubscribeAsync(UpnpClient_Handle Hnd,
	Upnp_SID SubsId,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	int retVal = UPNP_E_SUCCESS;
	ThreadPoolJob job;
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;

	memset(&job, 0, sizeof(job));

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpUnSubscribeAsync\n");

	if (UpnpSdkInit != 1) {
		retVal = UPNP_E_FINISH;
		goto exit_function;
	}

	if (SubsId == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (Fun == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		retVal = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	HandleUnlock(__FILE__, __LINE__);

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));
	if (Param == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = UNSUBSCRIBE;
	Param->Handle = Hnd;
	strncpy(Param->SubsId, SubsId, sizeof(Param->SubsId) - 1);
	Param->Fun = Fun;
	Param->Cookie = (void *)Cookie_const;
	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free);
	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free(Param);
	}

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpUnSubscribeAsync\n");

	return retVal;
}